

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O2

VRDatumPtr __thiscall MinVR::CreateVRDatumInt(MinVR *this,void *pData)

{
  VRDatum_conflict *pValue;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar1;
  
  pValue = (VRDatum_conflict *)operator_new(0x68);
  VRDatumInt::VRDatumInt((VRDatumInt *)pValue,*pData);
  VRDatumPtr::VRDatumPtr((VRDatumPtr *)this,pValue);
  VVar1.reference = extraout_RDX;
  VVar1.pData = (VRDatum_conflict *)this;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumInt(void *pData) {
  VRDatumInt *obj = new VRDatumInt(*static_cast<VRInt *>(pData));
  return VRDatumPtr(obj);
}